

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_set.cc
# Opt level: O3

int X509_set_serialNumber(X509 *x,ASN1_INTEGER *serial)

{
  uint uVar1;
  
  if ((serial->type | 0x100U) == 0x102) {
    if (x == (X509 *)0x0) {
      uVar1 = 0;
    }
    else {
      if (x->cert_info->serialNumber != serial) {
        serial = ASN1_INTEGER_dup(serial);
        if (serial == (ASN1_INTEGER *)0x0) {
          serial = (ASN1_INTEGER *)0x0;
        }
        else {
          ASN1_INTEGER_free(x->cert_info->serialNumber);
          x->cert_info->serialNumber = serial;
        }
      }
      uVar1 = (uint)(serial != (ASN1_INTEGER *)0x0);
    }
  }
  else {
    uVar1 = 0;
    ERR_put_error(0xc,0,0xbf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_set.cc"
                  ,0x3c);
  }
  return uVar1;
}

Assistant:

int X509_set_serialNumber(X509 *x, const ASN1_INTEGER *serial) {
  if (serial->type != V_ASN1_INTEGER && serial->type != V_ASN1_NEG_INTEGER) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
    return 0;
  }

  ASN1_INTEGER *in;
  if (x == NULL) {
    return 0;
  }
  in = x->cert_info->serialNumber;
  if (in != serial) {
    in = ASN1_INTEGER_dup(serial);
    if (in != NULL) {
      ASN1_INTEGER_free(x->cert_info->serialNumber);
      x->cert_info->serialNumber = in;
    }
  }
  return in != NULL;
}